

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O2

void __thiscall
icu_63::MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3>::MaybeStackArray
          (MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3> *this,
          MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3> *src)

{
  CodePointMatcher **__src;
  int iVar1;
  CodePointMatcher **ppCVar2;
  
  ppCVar2 = src->ptr;
  this->ptr = ppCVar2;
  iVar1 = src->capacity;
  this->capacity = iVar1;
  this->needToRelease = src->needToRelease;
  __src = src->stackArray;
  if (ppCVar2 != __src) {
    src->ptr = __src;
    src->capacity = 3;
    src->needToRelease = '\0';
    return;
  }
  this->ptr = this->stackArray;
  memcpy(this->stackArray,__src,(long)iVar1 << 3);
  return;
}

Assistant:

icu::MaybeStackArray<T, stackCapacity>::MaybeStackArray(
        MaybeStackArray <T, stackCapacity>&& src) U_NOEXCEPT
        : ptr(src.ptr), capacity(src.capacity), needToRelease(src.needToRelease) {
    if (src.ptr == src.stackArray) {
        ptr = stackArray;
        uprv_memcpy(stackArray, src.stackArray, sizeof(T) * src.capacity);
    } else {
        src.resetToStackArray();  // take ownership away from src
    }
}